

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.hpp
# Opt level: O3

vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> * __thiscall
CompoundFile::SAT::sectors
          (vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *__return_storage_ptr__
          ,SAT *this,SecID *firstSector)

{
  iterator __position;
  pointer pSVar1;
  Exception *this_00;
  pointer pSVar2;
  SecID id;
  wstring wStack_1c8;
  SecID local_1a8 [4];
  wostream local_198 [376];
  
  if ((int)((ulong)((long)(this->m_sat).
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_sat).
                         super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2) <= firstSector->m_id) {
    std::__cxx11::wstringstream::wstringstream((wstringstream *)local_1a8);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              (local_198,L"There is no such sector with id: ",0x21);
    std::wostream::operator<<(local_198,firstSector->m_id);
    this_00 = (Exception *)__cxa_allocate_exception(0x30);
    std::__cxx11::wstringbuf::str();
    Exception::Exception(this_00,&wStack_1c8);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  (__return_storage_ptr__->
  super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CompoundFile::SecID,std::allocator<CompoundFile::SecID>>::
  _M_realloc_insert<CompoundFile::SecID_const&>
            ((vector<CompoundFile::SecID,std::allocator<CompoundFile::SecID>> *)
             __return_storage_ptr__,(iterator)0x0,firstSector);
  pSVar1 = (this->m_sat).
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->m_sat).
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)(long)firstSector->m_id < (ulong)((long)pSVar2 - (long)pSVar1 >> 2)) {
    local_1a8[0].m_id = pSVar1[firstSector->m_id].m_id;
    if (-1 < local_1a8[0].m_id) {
      do {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CompoundFile::SecID,std::allocator<CompoundFile::SecID>>::
          _M_realloc_insert<CompoundFile::SecID_const&>
                    ((vector<CompoundFile::SecID,std::allocator<CompoundFile::SecID>> *)
                     __return_storage_ptr__,__position,local_1a8);
          pSVar1 = (this->m_sat).
                   super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar2 = (this->m_sat).
                   super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (__position._M_current)->m_id = local_1a8[0].m_id;
          (__return_storage_ptr__->
          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        if ((ulong)((long)pSVar2 - (long)pSVar1 >> 2) <= (ulong)(long)local_1a8[0].m_id)
        goto LAB_00106bc2;
        local_1a8[0].m_id = pSVar1[local_1a8[0].m_id].m_id;
      } while (-1 < local_1a8[0].m_id);
    }
    return __return_storage_ptr__;
  }
LAB_00106bc2:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

inline std::vector< SecID >
SAT::sectors( const SecID & firstSector ) const
{
	if( firstSector < static_cast< int32_t > ( m_sat.size() ) )
	{
		std::vector< SecID > result;

		result.push_back( firstSector );

		SecID id = m_sat.at( firstSector );

		while( true )
		{
			if( id >= 0 )
				result.push_back( id );
			else
				break;

			id = m_sat.at( id );
		}

		return result;
	}
	else
	{
		std::wstringstream stream;
		stream << L"There is no such sector with id: " << firstSector;

		throw Exception( stream.str() );
	}
}